

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O1

void __thiscall SM83::xor_dhl(SM83 *this)

{
  byte bVar1;
  byte bVar2;
  string_view fmt;
  format_args args;
  ulong local_78 [2];
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  local_78[0] = (ulong)(this->field_0).af;
  local_68 = (ulong)(this->field_1).bc;
  local_58 = (ulong)(this->field_2).de;
  local_48 = (ulong)(this->field_3).hl;
  local_38 = (ulong)this->sp;
  local_28 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x46;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  XOR (HL)\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_78;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  bVar1 = (this->field_0).field_1.a;
  bVar2 = Bus::Read8(this->bus,(this->field_3).hl,true);
  (this->field_0).field_1.f = (bVar1 == bVar2) << 7 | (this->field_0).field_1.f & 0xf;
  (this->field_0).field_1.a = bVar2 ^ bVar1;
  return;
}

Assistant:

void SM83::xor_dhl() {
    LTRACE("XOR (HL)");

    u8 result = a ^ bus.Read8(hl);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(false);

    a = result;
}